

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTBITDec2(octet *val,octet *der,size_t count,u32 tag,size_t len)

{
  ulong uVar1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t l;
  u32 local_3c;
  size_t local_38;
  
  sVar3 = derTLDec(&local_3c,&local_38,der,count);
  if ((sVar3 == 0xffffffffffffffff) || (uVar1 = local_38 + sVar3, count < uVar1)) {
    sVar4 = 0xffffffffffffffff;
  }
  else {
    sVar4 = 0xffffffffffffffff;
    if ((local_38 != 0 && local_3c == tag) && uVar1 != 0xffffffffffffffff) {
      bVar2 = der[sVar3];
      if ((((ulong)bVar2 < 8) &&
          (((local_38 != 1 || (bVar2 == 0)) && (local_38 * 8 + -8 == bVar2 + len)))) &&
         (sVar4 = uVar1, val != (octet *)0x0)) {
        memMove(val,der + sVar3 + 1,local_38 - 1);
      }
    }
  }
  return sVar4;
}

Assistant:

size_t derTBITDec2(octet* val, const octet der[], size_t count, u32 tag,
	size_t len)
{
	const octet* v;
	size_t l;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// число битов дополнения больше 7?
	// биты дополнения в несуществующем октете?
	// длина не соответствует ожидаемой?
	if (l < 1 || v[0] > 7 || v[0] != 0 && l == 1 || (l - 1) * 8 != len + v[0])
		return SIZE_MAX;
	// возвратить строку
	if (val)
		memMove(val, v + 1, l - 1);
	return count;
}